

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O2

O3DGCErrorCode __thiscall
o3dgc::AdjacencyInfo::AddNeighbor(AdjacencyInfo *this,long element,long neighbor)

{
  long lVar1;
  long lVar2;
  long p;
  
  if (this->m_numNeighbors[this->m_numElements + -1] < this->m_numNeighbors[element]) {
    __assert_fail("m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                  ,0x6c,"O3DGCErrorCode o3dgc::AdjacencyInfo::AddNeighbor(long, long)");
  }
  lVar1 = Begin(this,element);
  lVar2 = End(this,element);
  do {
    if (lVar2 <= lVar1) {
LAB_0037999c:
      return (O3DGCErrorCode)(lVar2 <= lVar1);
    }
    if (this->m_neighbors[lVar1] == -1) {
      this->m_neighbors[lVar1] = neighbor;
      goto LAB_0037999c;
    }
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

O3DGCErrorCode          AddNeighbor(long element, long neighbor)
                                {
                                    assert(m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]);
                                    long p0 = Begin(element);
                                    long p1 = End(element);
                                    for(long p = p0; p < p1; p++)
                                    {
                                        if (m_neighbors[p] == -1)
                                        {
                                            m_neighbors[p] = neighbor;
                                            return O3DGC_OK;
                                        }
                                    }
                                    return O3DGC_ERROR_BUFFER_FULL;
                                }